

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O0

int Gia_ManSopToAig(Gia_Man_t *p,char *pSop,Vec_Int_t *vLeaves)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  char *local_40;
  char *pCube;
  int local_30;
  int nFanins;
  int Value;
  int iSum;
  int iAnd;
  int i;
  Vec_Int_t *vLeaves_local;
  char *pSop_local;
  Gia_Man_t *p_local;
  
  iVar1 = Kit_PlaGetVarNum(pSop);
  nFanins = 0;
  local_40 = pSop;
  do {
    if (*local_40 == '\0') {
      iVar1 = Kit_PlaIsComplement(pSop);
      if (iVar1 != 0) {
        nFanins = Abc_LitNot(nFanins);
      }
      return nFanins;
    }
    Value = 1;
    iSum = 0;
    while( true ) {
      bVar3 = false;
      if (local_40[iSum] != ' ') {
        local_30 = (int)local_40[iSum];
        bVar3 = local_30 != 0;
      }
      if (!bVar3) break;
      iVar2 = Vec_IntEntry(vLeaves,iSum);
      if (iVar2 < 0) {
        __assert_fail("Vec_IntEntry(vLeaves, i) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFx.c"
                      ,0x54,"int Gia_ManSopToAig(Gia_Man_t *, char *, Vec_Int_t *)");
      }
      if (local_30 == 0x31) {
        iVar2 = Vec_IntEntry(vLeaves,iSum);
        Value = Gia_ManHashAnd(p,Value,iVar2);
      }
      else if (local_30 == 0x30) {
        iVar2 = Vec_IntEntry(vLeaves,iSum);
        iVar2 = Abc_LitNot(iVar2);
        Value = Gia_ManHashAnd(p,Value,iVar2);
      }
      else if (local_30 != 0x2d) {
        __assert_fail("Value == \'-\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFx.c"
                      ,0x59,"int Gia_ManSopToAig(Gia_Man_t *, char *, Vec_Int_t *)");
      }
      iSum = iSum + 1;
    }
    nFanins = Gia_ManHashOr(p,nFanins,Value);
    local_40 = local_40 + (iVar1 + 3);
  } while( true );
}

Assistant:

int Gia_ManSopToAig( Gia_Man_t * p, char * pSop, Vec_Int_t * vLeaves )
{
    int i, iAnd, iSum, Value, nFanins;
    char * pCube;
    // get the number of variables
    nFanins = Kit_PlaGetVarNum(pSop);
    // go through the cubes of the node's SOP
    iSum = 0;
    Kit_PlaForEachCube( pSop, nFanins, pCube )
    {
        // create the AND of literals
        iAnd = 1;
        Kit_PlaCubeForEachVar( pCube, Value, i )
        {
            assert( Vec_IntEntry(vLeaves, i) >= 0 );
            if ( Value == '1' )
                iAnd = Gia_ManHashAnd( p, iAnd, Vec_IntEntry(vLeaves, i) );
            else if ( Value == '0' )
                iAnd = Gia_ManHashAnd( p, iAnd, Abc_LitNot(Vec_IntEntry(vLeaves, i)) );
            else assert( Value == '-' );
        }
        // add to the sum of cubes
        iSum = Gia_ManHashOr( p, iSum, iAnd );
    }
    // decide whether to complement the result
    if ( Kit_PlaIsComplement(pSop) )
        iSum = Abc_LitNot(iSum);
    return iSum;
}